

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O3

bool __thiscall
nlohmann::detail::
binary_reader<nlohmann::basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_nlohmann::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_nlohmann::detail::json_sax_dom_parser<nlohmann::basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
::sax_parse(binary_reader<nlohmann::basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_nlohmann::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_nlohmann::detail::json_sax_dom_parser<nlohmann::basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
            *this,input_format_t format,json_sax_t *sax_,bool strict,cbor_tag_handler_t tag_handler)

{
  byte bVar1;
  byte *pbVar2;
  json_sax_dom_parser<nlohmann::basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  *this_00;
  size_t sVar3;
  bool bVar4;
  byte *pbVar5;
  basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  *in_R9;
  size_t sVar6;
  string local_108;
  undefined1 local_e8 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  string local_98;
  string local_78;
  undefined **local_58 [2];
  runtime_error local_48 [24];
  
  this->sax = sax_;
  switch(format) {
  case cbor:
    bVar4 = parse_cbor_internal(this,true,tag_handler);
    break;
  case msgpack:
    bVar4 = parse_msgpack_internal(this);
    break;
  case ubjson:
    bVar4 = parse_ubjson_internal(this,true);
    if (!bVar4 || !strict) {
      return bVar4;
    }
    goto LAB_00190dbd;
  case bson:
    bVar4 = parse_bson_internal(this);
    break;
  default:
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_c_cmakelists/Dinopony[P]randstalker/extlibs/landstalker_lib/landstalker-lib/tools/json.hpp"
                  ,0x2141,
                  "bool nlohmann::detail::binary_reader<nlohmann::basic_json<nlohmann::ordered_map>, nlohmann::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<const unsigned char *, std::vector<unsigned char>>>>::sax_parse(const input_format_t, json_sax_t *, const bool, const cbor_tag_handler_t) [BasicJsonType = nlohmann::basic_json<nlohmann::ordered_map>, InputAdapterType = nlohmann::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<const unsigned char *, std::vector<unsigned char>>>, SAX = nlohmann::detail::json_sax_dom_parser<nlohmann::basic_json<nlohmann::ordered_map>>]"
                 );
  }
  if ((bVar4 & strict) != 0) {
    if (format == ubjson) {
LAB_00190dbd:
      pbVar5 = (this->ia).current._M_current;
      pbVar2 = (this->ia).end._M_current;
      sVar6 = this->chars_read;
      do {
        sVar6 = sVar6 + 1;
        this->chars_read = sVar6;
        if (pbVar5 == pbVar2) goto LAB_00190f91;
        bVar1 = *pbVar5;
        pbVar5 = pbVar5 + 1;
        (this->ia).current._M_current = pbVar5;
        this->current = (ulong)bVar1;
      } while ((ulong)bVar1 == 0x4e);
    }
    else {
      pbVar5 = (this->ia).current._M_current;
      sVar6 = this->chars_read + 1;
      this->chars_read = sVar6;
      if (pbVar5 == (this->ia).end._M_current) {
LAB_00190f91:
        this->current = 0xffffffffffffffff;
        return true;
      }
      bVar1 = *pbVar5;
      (this->ia).current._M_current = pbVar5 + 1;
      this->current = (ulong)bVar1;
    }
    this_00 = this->sax;
    get_token_string(&local_78,this);
    sVar3 = this->chars_read;
    get_token_string((string *)(local_e8 + 0x10),this);
    std::operator+(&local_b8,"expected end of input; last byte: 0x",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   (local_e8 + 0x10));
    local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_108,"value","");
    exception_message(&local_98,this,format,&local_b8,&local_108);
    basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::basic_json((basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                  *)local_e8,(nullptr_t)0x0);
    parse_error::
    create<nlohmann::basic_json<nlohmann::ordered_map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
              ((parse_error *)local_58,(parse_error *)0x6e,(int)sVar3,(size_t)&local_98,
               (string *)local_e8,in_R9);
    bVar4 = json_sax_dom_parser<nlohmann::basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
            ::parse_error<nlohmann::detail::parse_error>
                      (this_00,sVar6,&local_78,(parse_error *)local_58);
    local_58[0] = &PTR__exception_00262418;
    std::runtime_error::~runtime_error
              ((runtime_error *)((long)&((parse_error *)local_58)->super_exception + 0x10));
    std::exception::~exception((exception *)local_58);
    basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::~basic_json((basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                   *)local_e8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_dataplus._M_p != &local_98.field_2) {
      operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_108._M_dataplus._M_p != &local_108.field_2) {
      operator_delete(local_108._M_dataplus._M_p,local_108.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
      operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e8._16_8_ != &local_c8) {
      operator_delete((void *)local_e8._16_8_,local_c8._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_dataplus._M_p != &local_78.field_2) {
      operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
    }
  }
  return bVar4;
}

Assistant:

JSON_HEDLEY_NON_NULL(3)
    bool sax_parse(const input_format_t format,
                   json_sax_t* sax_,
                   const bool strict = true,
                   const cbor_tag_handler_t tag_handler = cbor_tag_handler_t::error)
    {
        sax = sax_;
        bool result = false;

        switch (format)
        {
            case input_format_t::bson:
                result = parse_bson_internal();
                break;

            case input_format_t::cbor:
                result = parse_cbor_internal(true, tag_handler);
                break;

            case input_format_t::msgpack:
                result = parse_msgpack_internal();
                break;

            case input_format_t::ubjson:
                result = parse_ubjson_internal();
                break;

            case input_format_t::json: // LCOV_EXCL_LINE
            default:            // LCOV_EXCL_LINE
                JSON_ASSERT(false); // NOLINT(cert-dcl03-c,hicpp-static-assert,misc-static-assert) LCOV_EXCL_LINE
        }

        // strict mode: next byte must be EOF
        if (result && strict)
        {
            if (format == input_format_t::ubjson)
            {
                get_ignore_noop();
            }
            else
            {
                get();
            }

            if (JSON_HEDLEY_UNLIKELY(current != std::char_traits<char_type>::eof()))
            {
                return sax->parse_error(chars_read, get_token_string(),
                                        parse_error::create(110, chars_read, exception_message(format, "expected end of input; last byte: 0x" + get_token_string(), "value"), BasicJsonType()));
            }
        }

        return result;
    }